

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O1

void __thiscall tonk::Connection::OnTimeSync(Connection *this)

{
  uint in_EDX;
  long in_RSI;
  
  OnTimeSync(this,(uint8_t *)(in_RSI + -0x60),in_EDX);
  return;
}

Assistant:

Result Connection::OnTimeSync(const uint8_t* data, unsigned bytes)
{
    // If the message is truncated:
    if (bytes != kTimeSyncMessageBytes) {
        return Result("Connection::OnTimeSync", "Truncated time sync message", ErrorType::Tonk, Tonk_InvalidData);
    }

    // Read the 3-byte next expected nonce field
    const Counter24 nextExpectedNonce24 = siamese::ReadU24_LE_Min4Bytes(data);
    Outgoing.UpdateNextExpectedNonceFromTimeSync(nextExpectedNonce24);

    // Read the 3-byte MinDeltaTS24 field
    const Counter24 minDeltaTS24 = siamese::ReadU24_LE_Min4Bytes(data + 3);
    TimeSync.OnPeerMinDeltaTS24(minDeltaTS24);

    // Read ReceiverStatistics
    ReceiverStatistics stats;
    stats.Decompress(data + 3 + 3);

#ifdef TONK_ENABLE_VERBOSE_BANDWIDTH
    Logger.Debug("Connection::OnTimeSync(ReceivedBPS=", stats.GoodputBPS, ", LossRate=", stats.LossRate, ")");
#endif

    // Update the cached receiver state for statistics for the app
    {
        Locker locker(PublicAPILock);
        CachedReceiverStats = stats;
    }

    return Result::Success();
}